

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O1

int run_test_thread_rwlock(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 *extraout_RDX;
  uv_rwlock_t *unaff_RBX;
  int iVar2;
  int64_t eval_b;
  int64_t eval_a;
  uv_rwlock_t rwlock;
  uv_buf_t uStack_100;
  code *pcStack_f0;
  long lStack_e8;
  long lStack_e0;
  sockaddr_in sStack_d8;
  uv_cond_t *puStack_c8;
  long lStack_c0;
  long lStack_b8;
  uv_rwlock_t *puStack_b0;
  uv_thread_t uStack_68;
  uv_rwlock_t local_40;
  
  iVar1 = uv_rwlock_init(&local_40);
  if (iVar1 == 0) {
    uv_rwlock_rdlock(&local_40);
    uv_rwlock_rdunlock(&local_40);
    uv_rwlock_wrlock(&local_40);
    uv_rwlock_wrunlock(&local_40);
    uv_rwlock_destroy(&local_40);
    return 0;
  }
  run_test_thread_rwlock_cold_1();
  iVar1 = uv_cond_init(&condvar);
  uStack_68 = (uv_thread_t)iVar1;
  if (uStack_68 == 0) {
    iVar1 = uv_mutex_init(&mutex);
    uStack_68 = (uv_thread_t)iVar1;
    if (uStack_68 != 0) goto LAB_001aac9f;
    iVar1 = uv_rwlock_init(&::rwlock);
    uStack_68 = (uv_thread_t)iVar1;
    if (uStack_68 != 0) goto LAB_001aacae;
    uv_mutex_lock(&mutex);
    iVar1 = uv_thread_create(&uStack_68,thread_rwlock_trylock_peer,(void *)0x0);
    if (iVar1 != 0) goto LAB_001aacbd;
    iVar1 = uv_rwlock_trywrlock(&::rwlock);
    if (iVar1 != 0) goto LAB_001aaccc;
    synchronize();
    unaff_RBX = &::rwlock;
    uv_rwlock_wrunlock(&::rwlock);
    iVar1 = uv_rwlock_tryrdlock(&::rwlock);
    if (iVar1 != 0) goto LAB_001aacdb;
    synchronize();
    unaff_RBX = &::rwlock;
    uv_rwlock_rdunlock(&::rwlock);
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&::rwlock);
    if (iVar1 != -0x10) goto LAB_001aacea;
    iVar1 = uv_rwlock_trywrlock(&::rwlock);
    if (iVar1 != -0x10) goto LAB_001aacf9;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&::rwlock);
    if (iVar1 != 0) goto LAB_001aad08;
    unaff_RBX = &::rwlock;
    uv_rwlock_rdunlock(&::rwlock);
    iVar1 = uv_rwlock_trywrlock(&::rwlock);
    if (iVar1 != -0x10) goto LAB_001aad17;
    synchronize();
    iVar1 = uv_thread_join(&uStack_68);
    if (iVar1 == 0) {
      uv_rwlock_destroy(&::rwlock);
      uv_mutex_unlock(&mutex);
      uv_mutex_destroy(&mutex);
      uv_cond_destroy(&condvar);
      return 0;
    }
  }
  else {
    run_test_thread_rwlock_trylock_cold_1();
LAB_001aac9f:
    run_test_thread_rwlock_trylock_cold_2();
LAB_001aacae:
    run_test_thread_rwlock_trylock_cold_3();
LAB_001aacbd:
    run_test_thread_rwlock_trylock_cold_4();
LAB_001aaccc:
    run_test_thread_rwlock_trylock_cold_5();
LAB_001aacdb:
    run_test_thread_rwlock_trylock_cold_6();
LAB_001aacea:
    run_test_thread_rwlock_trylock_cold_7();
LAB_001aacf9:
    run_test_thread_rwlock_trylock_cold_8();
LAB_001aad08:
    run_test_thread_rwlock_trylock_cold_9();
LAB_001aad17:
    run_test_thread_rwlock_trylock_cold_10();
  }
  run_test_thread_rwlock_trylock_cold_11();
  uv_mutex_lock(&mutex);
  iVar1 = uv_rwlock_tryrdlock(&::rwlock);
  if (iVar1 == -0x10) {
    iVar1 = uv_rwlock_trywrlock(&::rwlock);
    if (iVar1 != -0x10) goto LAB_001aaea4;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&::rwlock);
    if (iVar1 != 0) goto LAB_001aaeb1;
    unaff_RBX = &::rwlock;
    uv_rwlock_rdunlock(&::rwlock);
    iVar1 = uv_rwlock_trywrlock(&::rwlock);
    if (iVar1 != -0x10) goto LAB_001aaebe;
    synchronize();
    iVar1 = uv_rwlock_trywrlock(&::rwlock);
    if (iVar1 != 0) goto LAB_001aaecb;
    synchronize();
    unaff_RBX = &::rwlock;
    uv_rwlock_wrunlock(&::rwlock);
    iVar1 = uv_rwlock_tryrdlock(&::rwlock);
    if (iVar1 == 0) {
      synchronize();
      uv_rwlock_rdunlock(&::rwlock);
      step = step + 1;
      uv_cond_signal(&condvar);
      uv_mutex_unlock(&mutex);
      return extraout_EAX;
    }
  }
  else {
    thread_rwlock_trylock_peer_cold_1();
LAB_001aaea4:
    thread_rwlock_trylock_peer_cold_2();
LAB_001aaeb1:
    thread_rwlock_trylock_peer_cold_3();
LAB_001aaebe:
    thread_rwlock_trylock_peer_cold_4();
LAB_001aaecb:
    thread_rwlock_trylock_peer_cold_5();
  }
  thread_rwlock_trylock_peer_cold_6();
  step = step + 1;
  puStack_c8 = (uv_cond_t *)0x1aaf03;
  puStack_b0 = unaff_RBX;
  uv_cond_signal(&condvar);
  iVar1 = step;
  lStack_c0 = (long)step;
  do {
    puStack_c8 = (uv_cond_t *)0x1aaf1c;
    uv_cond_wait(&condvar,&mutex);
    lStack_b8 = (long)step;
  } while (iVar1 == step);
  lStack_c0 = lStack_c0 + 1;
  if (lStack_b8 == lStack_c0) {
    return step;
  }
  puStack_c8 = (uv_cond_t *)0x1aaf56;
  synchronize_cold_1();
  puStack_c8 = &condvar;
  iVar2 = (int)&lStack_e8;
  pcStack_f0 = (code *)0x1aaf73;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_d8);
  lStack_e0 = (long)iVar1;
  lStack_e8 = 0;
  if (lStack_e0 == 0) {
    pcStack_f0 = (code *)0x1aaf9d;
    iVar1 = uv_loop_init(&loop);
    lStack_e0 = (long)iVar1;
    lStack_e8 = 0;
    if (lStack_e0 != 0) goto LAB_001ab143;
    pcStack_f0 = (code *)0x1aafce;
    iVar1 = uv_tcp_init(&loop,&tcp_client);
    lStack_e0 = (long)iVar1;
    lStack_e8 = 0;
    if (lStack_e0 != 0) goto LAB_001ab150;
    pcStack_f0 = (code *)0x1ab00b;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_client,(sockaddr *)&sStack_d8,connect_cb);
    lStack_e0 = (long)iVar1;
    lStack_e8 = 0;
    if (lStack_e0 != 0) goto LAB_001ab15d;
    pcStack_f0 = (code *)0x1ab037;
    iVar1 = uv_run(&loop,UV_RUN_DEFAULT);
    lStack_e0 = (long)iVar1;
    lStack_e8 = 0;
    if (lStack_e0 != 0) goto LAB_001ab16a;
    lStack_e0 = 1;
    lStack_e8 = (long)connect_cb_called;
    if (lStack_e8 != 1) goto LAB_001ab177;
    lStack_e0 = 1;
    lStack_e8 = (long)read_cb_called;
    if (lStack_e8 != 1) goto LAB_001ab184;
    lStack_e0 = 1;
    lStack_e8 = (long)write_cb_called;
    if (lStack_e8 != 1) goto LAB_001ab191;
    lStack_e0 = 1;
    lStack_e8 = (long)close_cb_called;
    if (lStack_e8 != 1) goto LAB_001ab19e;
    pcStack_f0 = (code *)0x1ab0f9;
    uv_walk(&loop,close_walk_cb,(void *)0x0);
    pcStack_f0 = (code *)0x1ab103;
    uv_run(&loop,UV_RUN_DEFAULT);
    lStack_e0 = 0;
    pcStack_f0 = (code *)0x1ab114;
    iVar1 = uv_loop_close(&loop);
    lStack_e8 = (long)iVar1;
    if (lStack_e0 == lStack_e8) {
      pcStack_f0 = (code *)0x1ab12e;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_f0 = (code *)0x1ab143;
    run_test_not_readable_nor_writable_on_read_error_cold_1();
LAB_001ab143:
    pcStack_f0 = (code *)0x1ab150;
    run_test_not_readable_nor_writable_on_read_error_cold_2();
LAB_001ab150:
    pcStack_f0 = (code *)0x1ab15d;
    run_test_not_readable_nor_writable_on_read_error_cold_3();
LAB_001ab15d:
    pcStack_f0 = (code *)0x1ab16a;
    run_test_not_readable_nor_writable_on_read_error_cold_4();
LAB_001ab16a:
    pcStack_f0 = (code *)0x1ab177;
    run_test_not_readable_nor_writable_on_read_error_cold_5();
LAB_001ab177:
    pcStack_f0 = (code *)0x1ab184;
    run_test_not_readable_nor_writable_on_read_error_cold_6();
LAB_001ab184:
    pcStack_f0 = (code *)0x1ab191;
    run_test_not_readable_nor_writable_on_read_error_cold_7();
LAB_001ab191:
    pcStack_f0 = (code *)0x1ab19e;
    run_test_not_readable_nor_writable_on_read_error_cold_8();
LAB_001ab19e:
    pcStack_f0 = (code *)0x1ab1ab;
    run_test_not_readable_nor_writable_on_read_error_cold_9();
  }
  pcStack_f0 = connect_cb;
  run_test_not_readable_nor_writable_on_read_error_cold_10();
  connect_cb_called = connect_cb_called + 1;
  uStack_100.base = (char *)(long)iVar2;
  if ((char *)(long)iVar2 == (char *)0x0) {
    iVar1 = uv_read_start((uv_stream_t *)&tcp_client,alloc_cb,read_cb);
    uStack_100.base = (char *)(long)iVar1;
    if ((char *)(long)iVar1 == (char *)0x0) {
      uStack_100 = uv_buf_init(reset_me_cmd,3);
      iVar1 = uv_write(&write_req,(uv_stream_t *)&tcp_client,&uStack_100,1,write_cb);
      pcStack_f0 = (code *)0x0;
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001ab297;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
LAB_001ab297:
  connect_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x40;
  return 0x3893e0;
}

Assistant:

TEST_IMPL(thread_rwlock) {
  uv_rwlock_t rwlock;
  int r;

  r = uv_rwlock_init(&rwlock);
  ASSERT_OK(r);

  uv_rwlock_rdlock(&rwlock);
  uv_rwlock_rdunlock(&rwlock);
  uv_rwlock_wrlock(&rwlock);
  uv_rwlock_wrunlock(&rwlock);
  uv_rwlock_destroy(&rwlock);

  return 0;
}